

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O1

bool __thiscall SQLite::Database::tableExists(Database *this,char *apTableName)

{
  int32_t iVar1;
  socklen_t in_ECX;
  long in_FS_OFFSET;
  Statement query;
  Column local_a0;
  Statement local_88;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  Statement::Statement
            (&local_88,this,"SELECT count(*) FROM sqlite_master WHERE type=\'table\' AND name=?");
  Statement::bind(&local_88,1,(sockaddr *)apTableName,in_ECX);
  Statement::executeStep(&local_88);
  Statement::getColumn(&local_a0,&local_88,0);
  iVar1 = Column::getInt(&local_a0);
  if (local_a0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  Statement::~Statement(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar1 == 1;
  }
  __stack_chk_fail();
}

Assistant:

bool Database::tableExists(const char* apTableName) const
{
    Statement query(*this, "SELECT count(*) FROM sqlite_master WHERE type='table' AND name=?");
    query.bind(1, apTableName);
    (void)query.executeStep(); // Cannot return false, as the above query always return a result
    return (1 == query.getColumn(0).getInt());
}